

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O1

RGB __thiscall
pbrt::GBufferFilm::ToOutputRGB(GBufferFilm *this,SampledSpectrum *L,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  SquareMatrix<3> *pSVar4;
  Float *pFVar5;
  long lVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar9 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [60];
  RGB RVar12;
  Float local_14;
  undefined8 local_10;
  undefined1 auVar7 [64];
  undefined1 auVar10 [64];
  
  auVar11 = in_ZMM1._4_60_;
  auVar8 = in_ZMM0._8_56_;
  RVar12 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,L,lambda);
  auVar10._0_4_ = RVar12.b;
  auVar10._4_60_ = auVar11;
  auVar7._0_8_ = RVar12._0_8_;
  auVar7._8_56_ = auVar8;
  pSVar4 = &this->outputRGBFromSensorRGB;
  local_10 = 0;
  local_14 = 0.0;
  auVar1 = vmovshdup_avx(auVar7._0_16_);
  lVar3 = 0;
  do {
    iVar2 = (int)lVar3;
    pFVar5 = (Float *)&local_10;
    if ((iVar2 != 0) && (pFVar5 = (Float *)((long)&local_10 + 4), iVar2 != 1)) {
      pFVar5 = &local_14;
    }
    *pFVar5 = 0.0;
    lVar6 = 0;
    do {
      auVar9 = auVar7._0_16_;
      if (((int)lVar6 != 0) && (auVar9 = auVar1, (int)lVar6 != 1)) {
        auVar9 = auVar10._0_16_;
      }
      pFVar5 = (Float *)&local_10;
      if ((iVar2 != 0) && (pFVar5 = (Float *)((long)&local_10 + 4), iVar2 != 1)) {
        pFVar5 = &local_14;
      }
      auVar9 = vfmadd213ss_fma(auVar9,ZEXT416((uint)pSVar4->m[0][lVar6]),ZEXT416((uint)*pFVar5));
      *pFVar5 = auVar9._0_4_;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar3 = lVar3 + 1;
    pSVar4 = (SquareMatrix<3> *)(pSVar4->m + 1);
  } while (lVar3 != 3);
  RVar12.b = local_14;
  RVar12.r = (Float)(undefined4)local_10;
  RVar12.g = (Float)local_10._4_4_;
  return RVar12;
}

Assistant:

PBRT_CPU_GPU
    RGB ToOutputRGB(const SampledSpectrum &L, const SampledWavelengths &lambda) const {
        RGB cameraRGB = sensor->ToSensorRGB(L, lambda);
        return outputRGBFromSensorRGB * cameraRGB;
    }